

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfHeader.c
# Opt level: O0

_Bool getIV(arguments *args)

{
  int_fast32_t fd;
  uint64_t *puVar1;
  uint64_t *iv;
  int64_t read;
  arguments *args_local;
  
  fd = openForRead(args->target_file);
  if ((fd < 1) ||
     (puVar1 = (uint64_t *)readBytes((ulong)(args->state_size >> 3),fd), puVar1 == (uint64_t *)0x0))
  {
    args_local._7_1_ = false;
  }
  else {
    args->iv = puVar1;
    args_local._7_1_ = true;
  }
  return args_local._7_1_;
}

Assistant:

bool getIV(arguments* args)
{
    int64_t read = openForRead(args->target_file);

    if(read > 0)
    {
       uint64_t* iv = (uint64_t*)readBytes((uint64_t)(args->state_size/8), read);
       if(iv != NULL)
       { 
           args->iv = iv;
           return true; 
       }
    }

    return false;
}